

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O3

void __thiscall FModelVertexBuffer::~FModelVertexBuffer(FModelVertexBuffer *this)

{
  ~FModelVertexBuffer(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

FModelVertexBuffer::~FModelVertexBuffer()
{
	if (ibo_id != 0)
	{
		glDeleteBuffers(1, &ibo_id);
	}
	if (vbo_ptr != nullptr)
	{
		delete[] vbo_ptr;
	}
}